

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O0

glyph_t * plutovg_font_face_get_glyph(plutovg_font_face_t *face,plutovg_codepoint_t codepoint)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  glyph_t **ppgVar4;
  glyph_t *pvertices;
  glyph_t *glyph;
  uint lsb;
  uint msb;
  plutovg_codepoint_t codepoint_local;
  plutovg_font_face_t *face_local;
  
  uVar1 = codepoint >> 8 & 0xff;
  if (face->glyphs[uVar1] == (glyph_t **)0x0) {
    ppgVar4 = (glyph_t **)calloc(0x100,8);
    face->glyphs[uVar1] = ppgVar4;
  }
  uVar2 = codepoint & 0xff;
  if (face->glyphs[uVar1][uVar2] == (glyph_t *)0x0) {
    pvertices = (glyph_t *)malloc(0x28);
    iVar3 = stbtt_FindGlyphIndex(&face->info,codepoint);
    pvertices->index = iVar3;
    iVar3 = stbtt_GetGlyphShape(&face->info,pvertices->index,(stbtt_vertex **)pvertices);
    pvertices->nvertices = iVar3;
    stbtt_GetGlyphHMetrics
              (&face->info,pvertices->index,&pvertices->advance_width,&pvertices->left_side_bearing)
    ;
    iVar3 = stbtt_GetGlyphBox(&face->info,pvertices->index,&pvertices->x1,&pvertices->y1,
                              &pvertices->x2,&pvertices->y2);
    if (iVar3 == 0) {
      pvertices->y2 = 0;
      pvertices->x2 = 0;
      pvertices->y1 = 0;
      pvertices->x1 = 0;
    }
    face->glyphs[uVar1][uVar2] = pvertices;
  }
  return face->glyphs[uVar1][uVar2];
}

Assistant:

static glyph_t* plutovg_font_face_get_glyph(plutovg_font_face_t* face, plutovg_codepoint_t codepoint)
{
    unsigned int msb = (codepoint >> 8) & 0xFF;
    if(face->glyphs[msb] == NULL) {
        face->glyphs[msb] = calloc(GLYPH_CACHE_SIZE, sizeof(glyph_t*));
    }

    unsigned int lsb = codepoint & 0xFF;
    if(face->glyphs[msb][lsb] == NULL) {
        glyph_t* glyph = malloc(sizeof(glyph_t));
        glyph->index = stbtt_FindGlyphIndex(&face->info, codepoint);
        glyph->nvertices = stbtt_GetGlyphShape(&face->info, glyph->index, &glyph->vertices);
        stbtt_GetGlyphHMetrics(&face->info, glyph->index, &glyph->advance_width, &glyph->left_side_bearing);
        if(!stbtt_GetGlyphBox(&face->info, glyph->index, &glyph->x1, &glyph->y1, &glyph->x2, &glyph->y2))
            glyph->x1 = glyph->y1 = glyph->x2 = glyph->y2 = 0;
        face->glyphs[msb][lsb] = glyph;
    }

    return face->glyphs[msb][lsb];
}